

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_wallmarks.cxx
# Opt level: O0

void __thiscall write_wm_slot::operator()(write_wm_slot *this,wm_slot *slot,xr_writer *w)

{
  size_type value;
  xr_writer *w_local;
  wm_slot *slot_local;
  write_wm_slot *this_local;
  
  value = std::vector<xray_re::wm_data,_std::allocator<xray_re::wm_data>_>::size(&slot->wallmarks);
  xray_re::xr_writer::w_size_u32(w,value);
  xray_re::xr_writer::w_sz(w,&slot->shader);
  xray_re::xr_writer::w_sz(w,&slot->texture);
  xray_re::xr_writer::
  w_seq<std::vector<xray_re::wm_data,std::allocator<xray_re::wm_data>>,write_wm_data>
            (w,&slot->wallmarks);
  return;
}

Assistant:

void operator()(const wm_slot* slot, xr_writer& w) const {
	w.w_size_u32(slot->wallmarks.size());
	w.w_sz(slot->shader);
	w.w_sz(slot->texture);
	w.w_seq(slot->wallmarks, write_wm_data());
}